

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

bool __thiscall ON_UuidPtrList2::FindUuid(ON_UuidPtrList2 *this,ON_UUID *uuid,ON__UINT_PTR *index)

{
  iterator iVar1;
  
  iVar1 = std::
          _Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_unsigned_long>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<ON_UUID_struct,_std::pair<const_ON_UUID_struct,_unsigned_long>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ON_UUID_struct>,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this->m_private)._M_t.
                    super___uniq_ptr_impl<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ON_UuidPtrList2_Private_*,_std::default_delete<ON_UuidPtrList2_Private>_>
                    .super__Head_base<0UL,_ON_UuidPtrList2_Private_*,_false>._M_head_impl,uuid);
  if (index != (ON__UINT_PTR *)0x0 &&
      iVar1.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>._M_cur
      != (__node_type *)0x0) {
    *index = *(ON__UINT_PTR *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>
                     ._M_cur + 0x18);
  }
  return iVar1.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool ON_UuidPtrList2::FindUuid(const ON_UUID& uuid, ON__UINT_PTR* index) const
{
  const auto it = m_private->map.find(uuid);

  if (it != m_private->map.end())
  {
    if (index)
    {
      *index = it->second;
    }
    return true;
  }
  return false;
}